

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDMeshFragment * __thiscall
ON_SubDMeshFragment::PreviousFaceFragment(ON_SubDMeshFragment *this,bool bLastFromFirst)

{
  ushort uVar1;
  ON_SubDMeshFragment *pOVar2;
  
  if (this->m_face != (ON_SubDFace *)0x0) {
    uVar1 = this->m_face_fragment_index;
    if (uVar1 < this->m_face_fragment_count) {
      if (bLastFromFirst && uVar1 == 0) {
        pOVar2 = LastFaceFragment(this);
        return pOVar2;
      }
      if ((((uVar1 != 0) && (pOVar2 = this->m_prev_fragment, pOVar2 != (ON_SubDMeshFragment *)0x0))
          && (this->m_face == pOVar2->m_face)) &&
         ((this->m_face_fragment_count == pOVar2->m_face_fragment_count &&
          (uVar1 - 1 == (uint)pOVar2->m_face_fragment_index)))) {
        return pOVar2;
      }
    }
  }
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragment::PreviousFaceFragment(
  bool bLastFromFirst
) const
{
  if ( nullptr != m_face && m_face_fragment_index < m_face_fragment_count )
  {
    if (bLastFromFirst && 0 == m_face_fragment_index)
    {
      return LastFaceFragment();
    }
    else if (
      m_face_fragment_index > 0
      && nullptr != m_prev_fragment
      && m_face == m_prev_fragment->m_face
      && m_face_fragment_count == m_prev_fragment->m_face_fragment_count
      && m_face_fragment_index - 1 == m_prev_fragment->m_face_fragment_index
      )
    {
      return m_prev_fragment;
    }
  }
  return nullptr;
}